

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void search_norestore(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                     RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  int64_t iVar1;
  
  iVar1 = sse_restoration_unit
                    (limits,*priv,
                     (YV12_BUFFER_CONFIG *)(*(long *)(*(long *)((long)priv + 0x10) + 0xe8) + 0x4e0),
                     *(int *)((long)priv + 0x20),
                     (uint)*(byte *)(*(long *)(*(long *)((long)priv + 0x10) + 0x6088) + 0x4c));
  *(int64_t *)((long)priv + 0x60) = iVar1;
  *(long *)((long)priv + 0x80) = *(long *)((long)priv + 0x80) + iVar1;
  return;
}

Assistant:

static inline void search_norestore(
    const RestorationTileLimits *limits, int rest_unit_idx, void *priv,
    int32_t *tmpbuf, RestorationLineBuffers *rlbs,
    struct aom_internal_error_info *error_info) {
  (void)rest_unit_idx;
  (void)tmpbuf;
  (void)rlbs;
  (void)error_info;

  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;

  const int highbd = rsc->cm->seq_params->use_highbitdepth;
  rsc->sse[RESTORE_NONE] = sse_restoration_unit(
      limits, rsc->src, &rsc->cm->cur_frame->buf, rsc->plane, highbd);

  rsc->total_sse[RESTORE_NONE] += rsc->sse[RESTORE_NONE];
}